

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_getlocal(lua_State *L)

{
  ulong uVar1;
  int32_t n;
  int32_t level;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  lua_State *L_00;
  lua_Debug ar;
  lua_Debug local_a0;
  
  uVar4 = 0;
  L_00 = L;
  if ((L->base < L->top) &&
     (uVar1 = L->base->u64, uVar4 = 0, (uVar1 & 0xffff800000000000) == 0xfffc800000000000)) {
    uVar4 = 1;
    L_00 = (lua_State *)(uVar1 & 0x7fffffffffff);
  }
  n = lj_lib_checkint(L,uVar4 + 2);
  if ((L->base[uVar4].u64 & 0xffff800000000000) == 0xfffb800000000000) {
    L->top = L->base + (ulong)uVar4 + 1;
    pcVar3 = lua_getlocal(L,(lua_Debug *)0x0,n);
    lua_pushstring(L,pcVar3);
  }
  else {
    level = lj_lib_checkint(L,uVar4 + 1);
    iVar2 = lua_getstack(L_00,level,&local_a0);
    if (iVar2 == 0) {
      lj_err_arg(L,uVar4 + 1,LJ_ERR_LVLRNG);
    }
    pcVar3 = lua_getlocal(L_00,&local_a0,n);
    if (pcVar3 != (char *)0x0) {
      lua_xmove(L_00,L,1);
      lua_pushstring(L,pcVar3);
      lua_pushvalue(L,-2);
      return 2;
    }
    L->top[-1].u64 = 0xffffffffffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_getlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  const char *name;
  int slot = lj_lib_checkint(L, arg+2);
  if (tvisfunc(L->base+arg)) {
    L->top = L->base+arg+1;
    lua_pushstring(L, lua_getlocal(L, NULL, slot));
    return 1;
  }
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  name = lua_getlocal(L1, &ar, slot);
  if (name) {
    lua_xmove(L1, L, 1);
    lua_pushstring(L, name);
    lua_pushvalue(L, -2);
    return 2;
  } else {
    setnilV(L->top-1);
    return 1;
  }
}